

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STL_Exercises.cpp
# Opt level: O0

void Question_4(void)

{
  bool bVar1;
  mapped_type *pmVar2;
  pointer ppVar3;
  ostream *poVar4;
  _Self local_70;
  _Self local_68;
  iterator it;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> m;
  int ans2;
  int ans1;
  int num;
  int n;
  
  m._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  std::istream::operator>>((istream *)&std::cin,&ans1);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_48)
  ;
  for (local_4c = 0; local_4c < ans1; local_4c = local_4c + 1) {
    std::istream::operator>>((istream *)&std::cin,&ans2);
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)local_48,&ans2);
    *pmVar2 = *pmVar2 + 1;
  }
  local_68._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                 ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                  local_48);
  while( true ) {
    local_70._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                   ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                    local_48);
    bVar1 = std::operator!=(&local_68,&local_70);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_68);
    if ((int)m._M_t._M_impl.super__Rb_tree_header._M_node_count < ppVar3->second) {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_68);
      m._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = ppVar3->second;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_68);
      m._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = ppVar3->first;
    }
    std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++(&local_68,0);
  }
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,m._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_
                     );
  poVar4 = std::operator<<(poVar4," ");
  std::ostream::operator<<(poVar4,(int)m._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_48)
  ;
  return;
}

Assistant:

void Question_4()
{
    int n,num,ans1,ans2 = 0;
    cin >>n;
    map<int,int > m;
    for (int i = 0; i < n; ++i) {
        cin >> num;
        m[num]++;
    }
    for (map<int,int>::iterator it = m.begin(); it != m.end(); it ++)
    {
        if((it->second) > ans2)  //找到其中次数最多的
        {
            ans2 = it -> second;
            ans1 = it -> first;
        }
    }
    cout << ans1 << " " << ans2;
}